

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O1

namespace_t __thiscall cs::domain_manager::get_namespace(domain_manager *this)

{
  char cVar1;
  undefined8 *puVar2;
  char *pcVar3;
  long lVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  undefined1 auVar14 [11];
  undefined1 auVar15 [11];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [13];
  undefined1 auVar19 [13];
  undefined1 auVar20 [14];
  undefined1 auVar21 [14];
  size_t sVar22;
  error *this_00;
  uint uVar23;
  ulong uVar24;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var25;
  char *pcVar26;
  long in_RSI;
  value_type *it;
  key_arg<std::__cxx11::basic_string<char>_> *key;
  domain_type *__range2;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  namespace_t nVar27;
  string local_50;
  
  this->fiber_stack = (stack_pointer *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cs::name_space,std::allocator<cs::name_space>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->m_set,(name_space **)this,
             (allocator<cs::name_space> *)&local_50);
  puVar2 = *(undefined8 **)(in_RSI + 0x30);
  if (*(undefined8 **)(in_RSI + 0x38) != puVar2) {
    pcVar3 = (char *)*puVar2;
    key = (key_arg<std::__cxx11::basic_string<char>_> *)puVar2[1];
    cVar1 = *pcVar3;
    pcVar26 = pcVar3;
    _Var25._M_pi = extraout_RDX;
    while (cVar1 < -1) {
      iVar10 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                      CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
      iVar11 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                      CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
      iVar12 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                      CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
      iVar13 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                      CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
      in_XMM1_Ba = -(*pcVar26 < (char)iVar10);
      in_XMM1_Bb = -(pcVar26[1] < (char)((uint)iVar10 >> 8));
      in_XMM1_Bc = -(pcVar26[2] < (char)((uint)iVar10 >> 0x10));
      in_XMM1_Bd = -(pcVar26[3] < (char)((uint)iVar10 >> 0x18));
      in_XMM1_Be = -(pcVar26[4] < (char)iVar11);
      in_XMM1_Bf = -(pcVar26[5] < (char)((uint)iVar11 >> 8));
      in_XMM1_Bg = -(pcVar26[6] < (char)((uint)iVar11 >> 0x10));
      in_XMM1_Bh = -(pcVar26[7] < (char)((uint)iVar11 >> 0x18));
      in_XMM1_Bi = -(pcVar26[8] < (char)iVar12);
      in_XMM1_Bj = -(pcVar26[9] < (char)((uint)iVar12 >> 8));
      in_XMM1_Bk = -(pcVar26[10] < (char)((uint)iVar12 >> 0x10));
      in_XMM1_Bl = -(pcVar26[0xb] < (char)((uint)iVar12 >> 0x18));
      in_XMM1_Bm = -(pcVar26[0xc] < (char)iVar13);
      in_XMM1_Bn = -(pcVar26[0xd] < (char)((uint)iVar13 >> 8));
      in_XMM1_Bo = -(pcVar26[0xe] < (char)((uint)iVar13 >> 0x10));
      in_XMM1_Bp = -(pcVar26[0xf] < (char)((uint)iVar13 >> 0x18));
      auVar6[1] = in_XMM1_Bb;
      auVar6[0] = in_XMM1_Ba;
      auVar6[2] = in_XMM1_Bc;
      auVar6[3] = in_XMM1_Bd;
      auVar6[4] = in_XMM1_Be;
      auVar6[5] = in_XMM1_Bf;
      auVar6[6] = in_XMM1_Bg;
      auVar6[7] = in_XMM1_Bh;
      auVar6[8] = in_XMM1_Bi;
      auVar6[9] = in_XMM1_Bj;
      auVar6[10] = in_XMM1_Bk;
      auVar6[0xb] = in_XMM1_Bl;
      auVar6[0xc] = in_XMM1_Bm;
      auVar6[0xd] = in_XMM1_Bn;
      auVar6[0xe] = in_XMM1_Bo;
      auVar6[0xf] = in_XMM1_Bp;
      auVar7[1] = in_XMM1_Bb;
      auVar7[0] = in_XMM1_Ba;
      auVar7[2] = in_XMM1_Bc;
      auVar7[3] = in_XMM1_Bd;
      auVar7[4] = in_XMM1_Be;
      auVar7[5] = in_XMM1_Bf;
      auVar7[6] = in_XMM1_Bg;
      auVar7[7] = in_XMM1_Bh;
      auVar7[8] = in_XMM1_Bi;
      auVar7[9] = in_XMM1_Bj;
      auVar7[10] = in_XMM1_Bk;
      auVar7[0xb] = in_XMM1_Bl;
      auVar7[0xc] = in_XMM1_Bm;
      auVar7[0xd] = in_XMM1_Bn;
      auVar7[0xe] = in_XMM1_Bo;
      auVar7[0xf] = in_XMM1_Bp;
      auVar20[1] = in_XMM1_Bd;
      auVar20[0] = in_XMM1_Bc;
      auVar20[2] = in_XMM1_Be;
      auVar20[3] = in_XMM1_Bf;
      auVar20[4] = in_XMM1_Bg;
      auVar20[5] = in_XMM1_Bh;
      auVar20[6] = in_XMM1_Bi;
      auVar20[7] = in_XMM1_Bj;
      auVar20[8] = in_XMM1_Bk;
      auVar20[9] = in_XMM1_Bl;
      auVar20[10] = in_XMM1_Bm;
      auVar20[0xb] = in_XMM1_Bn;
      auVar20[0xc] = in_XMM1_Bo;
      auVar20[0xd] = in_XMM1_Bp;
      auVar18[1] = in_XMM1_Be;
      auVar18[0] = in_XMM1_Bd;
      auVar18[2] = in_XMM1_Bf;
      auVar18[3] = in_XMM1_Bg;
      auVar18[4] = in_XMM1_Bh;
      auVar18[5] = in_XMM1_Bi;
      auVar18[6] = in_XMM1_Bj;
      auVar18[7] = in_XMM1_Bk;
      auVar18[8] = in_XMM1_Bl;
      auVar18[9] = in_XMM1_Bm;
      auVar18[10] = in_XMM1_Bn;
      auVar18[0xb] = in_XMM1_Bo;
      auVar18[0xc] = in_XMM1_Bp;
      auVar16[1] = in_XMM1_Bf;
      auVar16[0] = in_XMM1_Be;
      auVar16[2] = in_XMM1_Bg;
      auVar16[3] = in_XMM1_Bh;
      auVar16[4] = in_XMM1_Bi;
      auVar16[5] = in_XMM1_Bj;
      auVar16[6] = in_XMM1_Bk;
      auVar16[7] = in_XMM1_Bl;
      auVar16[8] = in_XMM1_Bm;
      auVar16[9] = in_XMM1_Bn;
      auVar16[10] = in_XMM1_Bo;
      auVar16[0xb] = in_XMM1_Bp;
      auVar14[1] = in_XMM1_Bg;
      auVar14[0] = in_XMM1_Bf;
      auVar14[2] = in_XMM1_Bh;
      auVar14[3] = in_XMM1_Bi;
      auVar14[4] = in_XMM1_Bj;
      auVar14[5] = in_XMM1_Bk;
      auVar14[6] = in_XMM1_Bl;
      auVar14[7] = in_XMM1_Bm;
      auVar14[8] = in_XMM1_Bn;
      auVar14[9] = in_XMM1_Bo;
      auVar14[10] = in_XMM1_Bp;
      uVar23 = (ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB141(auVar20 >> 7,0) & 1) << 2 |
                        (ushort)(SUB131(auVar18 >> 7,0) & 1) << 3 |
                        (ushort)(SUB121(auVar16 >> 7,0) & 1) << 4 |
                        (ushort)(SUB111(auVar14 >> 7,0) & 1) << 5 |
                        (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                 CONCAT18(in_XMM1_Bo,
                                                          CONCAT17(in_XMM1_Bn,
                                                                   CONCAT16(in_XMM1_Bm,
                                                                            CONCAT15(in_XMM1_Bl,
                                                                                     CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                        (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                 CONCAT17(in_XMM1_Bo,
                                                          CONCAT16(in_XMM1_Bn,
                                                                   CONCAT15(in_XMM1_Bm,
                                                                            CONCAT14(in_XMM1_Bl,
                                                                                     CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                       7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
      uVar5 = 0;
      if (uVar23 != 0) {
        for (; (uVar23 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      uVar24 = (ulong)uVar5;
      _Var25._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar24 * 5);
      key = (key_arg<std::__cxx11::basic_string<char>_> *)((long)key + uVar24 * 0x28);
      cVar1 = pcVar26[uVar24];
      pcVar26 = pcVar26 + uVar24;
    }
    lVar4 = puVar2[3];
    if (pcVar26 != pcVar3 + lVar4) {
      do {
        sVar22 = phmap::priv::
                 raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 ::count<std::__cxx11::string>
                           ((raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)(in_RSI + 0x58),key);
        _Var25._M_pi = extraout_RDX_00;
        if (sVar22 == 0) {
          domain_type::add_var
                    ((domain_type *)this->fiber_stack[1],key,
                     (var *)((long)key[1]._M_dataplus._M_p * 8 + puVar2[8]));
          _Var25._M_pi = extraout_RDX_01;
        }
        key = (key_arg<std::__cxx11::basic_string<char>_> *)&key[1]._M_string_length;
        cVar1 = pcVar26[1];
        pcVar26 = pcVar26 + 1;
        while (cVar1 < -1) {
          iVar10 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba)))
                          == CONCAT13(in_XMM1_Bd,
                                      CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
          iVar11 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be)))
                          == CONCAT13(in_XMM1_Bh,
                                      CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
          iVar12 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi)))
                          == CONCAT13(in_XMM1_Bl,
                                      CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
          iVar13 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                          == CONCAT13(in_XMM1_Bp,
                                      CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
          in_XMM1_Ba = -(*pcVar26 < (char)iVar10);
          in_XMM1_Bb = -(pcVar26[1] < (char)((uint)iVar10 >> 8));
          in_XMM1_Bc = -(pcVar26[2] < (char)((uint)iVar10 >> 0x10));
          in_XMM1_Bd = -(pcVar26[3] < (char)((uint)iVar10 >> 0x18));
          in_XMM1_Be = -(pcVar26[4] < (char)iVar11);
          in_XMM1_Bf = -(pcVar26[5] < (char)((uint)iVar11 >> 8));
          in_XMM1_Bg = -(pcVar26[6] < (char)((uint)iVar11 >> 0x10));
          in_XMM1_Bh = -(pcVar26[7] < (char)((uint)iVar11 >> 0x18));
          in_XMM1_Bi = -(pcVar26[8] < (char)iVar12);
          in_XMM1_Bj = -(pcVar26[9] < (char)((uint)iVar12 >> 8));
          in_XMM1_Bk = -(pcVar26[10] < (char)((uint)iVar12 >> 0x10));
          in_XMM1_Bl = -(pcVar26[0xb] < (char)((uint)iVar12 >> 0x18));
          in_XMM1_Bm = -(pcVar26[0xc] < (char)iVar13);
          in_XMM1_Bn = -(pcVar26[0xd] < (char)((uint)iVar13 >> 8));
          in_XMM1_Bo = -(pcVar26[0xe] < (char)((uint)iVar13 >> 0x10));
          in_XMM1_Bp = -(pcVar26[0xf] < (char)((uint)iVar13 >> 0x18));
          auVar8[1] = in_XMM1_Bb;
          auVar8[0] = in_XMM1_Ba;
          auVar8[2] = in_XMM1_Bc;
          auVar8[3] = in_XMM1_Bd;
          auVar8[4] = in_XMM1_Be;
          auVar8[5] = in_XMM1_Bf;
          auVar8[6] = in_XMM1_Bg;
          auVar8[7] = in_XMM1_Bh;
          auVar8[8] = in_XMM1_Bi;
          auVar8[9] = in_XMM1_Bj;
          auVar8[10] = in_XMM1_Bk;
          auVar8[0xb] = in_XMM1_Bl;
          auVar8[0xc] = in_XMM1_Bm;
          auVar8[0xd] = in_XMM1_Bn;
          auVar8[0xe] = in_XMM1_Bo;
          auVar8[0xf] = in_XMM1_Bp;
          auVar9[1] = in_XMM1_Bb;
          auVar9[0] = in_XMM1_Ba;
          auVar9[2] = in_XMM1_Bc;
          auVar9[3] = in_XMM1_Bd;
          auVar9[4] = in_XMM1_Be;
          auVar9[5] = in_XMM1_Bf;
          auVar9[6] = in_XMM1_Bg;
          auVar9[7] = in_XMM1_Bh;
          auVar9[8] = in_XMM1_Bi;
          auVar9[9] = in_XMM1_Bj;
          auVar9[10] = in_XMM1_Bk;
          auVar9[0xb] = in_XMM1_Bl;
          auVar9[0xc] = in_XMM1_Bm;
          auVar9[0xd] = in_XMM1_Bn;
          auVar9[0xe] = in_XMM1_Bo;
          auVar9[0xf] = in_XMM1_Bp;
          auVar21[1] = in_XMM1_Bd;
          auVar21[0] = in_XMM1_Bc;
          auVar21[2] = in_XMM1_Be;
          auVar21[3] = in_XMM1_Bf;
          auVar21[4] = in_XMM1_Bg;
          auVar21[5] = in_XMM1_Bh;
          auVar21[6] = in_XMM1_Bi;
          auVar21[7] = in_XMM1_Bj;
          auVar21[8] = in_XMM1_Bk;
          auVar21[9] = in_XMM1_Bl;
          auVar21[10] = in_XMM1_Bm;
          auVar21[0xb] = in_XMM1_Bn;
          auVar21[0xc] = in_XMM1_Bo;
          auVar21[0xd] = in_XMM1_Bp;
          auVar19[1] = in_XMM1_Be;
          auVar19[0] = in_XMM1_Bd;
          auVar19[2] = in_XMM1_Bf;
          auVar19[3] = in_XMM1_Bg;
          auVar19[4] = in_XMM1_Bh;
          auVar19[5] = in_XMM1_Bi;
          auVar19[6] = in_XMM1_Bj;
          auVar19[7] = in_XMM1_Bk;
          auVar19[8] = in_XMM1_Bl;
          auVar19[9] = in_XMM1_Bm;
          auVar19[10] = in_XMM1_Bn;
          auVar19[0xb] = in_XMM1_Bo;
          auVar19[0xc] = in_XMM1_Bp;
          auVar17[1] = in_XMM1_Bf;
          auVar17[0] = in_XMM1_Be;
          auVar17[2] = in_XMM1_Bg;
          auVar17[3] = in_XMM1_Bh;
          auVar17[4] = in_XMM1_Bi;
          auVar17[5] = in_XMM1_Bj;
          auVar17[6] = in_XMM1_Bk;
          auVar17[7] = in_XMM1_Bl;
          auVar17[8] = in_XMM1_Bm;
          auVar17[9] = in_XMM1_Bn;
          auVar17[10] = in_XMM1_Bo;
          auVar17[0xb] = in_XMM1_Bp;
          auVar15[1] = in_XMM1_Bg;
          auVar15[0] = in_XMM1_Bf;
          auVar15[2] = in_XMM1_Bh;
          auVar15[3] = in_XMM1_Bi;
          auVar15[4] = in_XMM1_Bj;
          auVar15[5] = in_XMM1_Bk;
          auVar15[6] = in_XMM1_Bl;
          auVar15[7] = in_XMM1_Bm;
          auVar15[8] = in_XMM1_Bn;
          auVar15[9] = in_XMM1_Bo;
          auVar15[10] = in_XMM1_Bp;
          uVar23 = (ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB141(auVar21 >> 7,0) & 1) << 2 |
                            (ushort)(SUB131(auVar19 >> 7,0) & 1) << 3 |
                            (ushort)(SUB121(auVar17 >> 7,0) & 1) << 4 |
                            (ushort)(SUB111(auVar15 >> 7,0) & 1) << 5 |
                            (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                     CONCAT18(in_XMM1_Bo,
                                                              CONCAT17(in_XMM1_Bn,
                                                                       CONCAT16(in_XMM1_Bm,
                                                                                CONCAT15(in_XMM1_Bl,
                                                                                         CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                            (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                     CONCAT17(in_XMM1_Bo,
                                                              CONCAT16(in_XMM1_Bn,
                                                                       CONCAT15(in_XMM1_Bm,
                                                                                CONCAT14(in_XMM1_Bl,
                                                                                         CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                           7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
          uVar5 = 0;
          if (uVar23 != 0) {
            for (; (uVar23 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
            }
          }
          uVar24 = (ulong)uVar5;
          _Var25._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar24 * 5);
          key = (key_arg<std::__cxx11::basic_string<char>_> *)((long)key + uVar24 * 0x28);
          cVar1 = pcVar26[uVar24];
          pcVar26 = pcVar26 + uVar24;
        }
      } while (pcVar26 != pcVar3 + lVar4);
    }
    nVar27.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var25._M_pi;
    nVar27.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (namespace_t)nVar27.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (error *)__cxa_allocate_exception(0x28);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50.field_2._M_allocated_capacity._0_4_ = 0x30303045;
  local_50.field_2._M_allocated_capacity._4_2_ = 0x48;
  local_50._M_string_length = 5;
  cov::error::error(this_00,&local_50);
  __cxa_throw(this_00,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

namespace_t get_namespace() const
		{
			namespace_t nm = std::make_shared<name_space>();
			const domain_type &global = m_data.bottom();
			for (auto &it: global) {
				if (buildin_symbols.count(it.first) == 0)
					nm->add_var(it.first, global.get_var_by_id(it.second));
			}
			return nm;
		}